

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printPredicateOperand(MCInst *MI,uint OpNo,SStream *O,char *Modifier)

{
  arm64_cc aVar1;
  int iVar2;
  MCOperand *op;
  ulong uVar3;
  undefined4 in_register_00000034;
  char *s;
  arm64_cc aVar4;
  
  op = MCInst_getOperand(MI,0);
  uVar3 = MCOperand_getImm(op);
  aVar4 = (arm64_cc)uVar3;
  aVar1 = aVar4;
  if ((int)aVar4 < 0x46) {
    switch(aVar4) {
    case ARM64_CC_PL:
    case ARM64_CC_VS:
      aVar1 = ARM64_CC_LO;
      break;
    case ARM64_CC_VC:
    case ARM64_CC_HI:
    case ARM64_CC_LS:
    case ARM64_CC_GE:
    case ARM64_CC_LT:
    case ARM64_CC_GT:
      break;
    case ARM64_CC_LE:
    case ARM64_CC_AL:
      aVar1 = ARM64_CC_LT;
      break;
    default:
      switch(aVar4) {
      case 0x26:
      case 0x27:
        aVar1 = 0x24;
        break;
      case 0x2e:
      case 0x2f:
        aVar1 = 0x2c;
      }
    }
  }
  else {
    switch(aVar4) {
    case 0x46:
    case 0x47:
      aVar1 = 0x44;
      break;
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      break;
    case 0x4e:
    case 0x4f:
      aVar1 = 0x4c;
      break;
    default:
      switch(aVar4) {
      case 0x66:
      case 0x67:
        aVar1 = 100;
        break;
      case 0x6e:
      case 0x6f:
        aVar1 = 0x6c;
      }
    }
  }
  (MI->flat_insn->detail->field_6).arm64.cc = aVar1;
  iVar2 = strcmp(O->buffer,"cc");
  if (iVar2 == 0) {
    if ((int)aVar4 < 0x4c) {
      if (aVar4 < 0x30) {
        if ((0xd0UL >> (uVar3 & 0x3f) & 1) != 0) {
          s = "ge";
          goto LAB_001a3cff;
        }
        if ((0xd000000000U >> (uVar3 & 0x3f) & 1) != 0) {
          s = "le";
          goto LAB_001a3cff;
        }
        if ((0xd00000000000U >> (uVar3 & 0x3f) & 1) != 0) {
          s = "gt";
          goto LAB_001a3cff;
        }
      }
      if ((aVar4 - 0x46 < 2) || (aVar4 == 0x44)) {
        s = "ne";
        goto LAB_001a3cff;
      }
    }
    else {
      uVar3 = (ulong)(aVar4 - 0x4c);
      if (aVar4 - 0x4c < 0x24) {
        if ((0xdUL >> (uVar3 & 0x3f) & 1) != 0) {
          s = "eq";
          goto LAB_001a3cff;
        }
        if ((0xd000000UL >> (uVar3 & 0x3f) & 1) != 0) {
          s = "nu";
          goto LAB_001a3cff;
        }
        if ((0xd00000000U >> (uVar3 & 0x3f) & 1) != 0) {
          s = "un";
          goto LAB_001a3cff;
        }
      }
      if (aVar4 - 0x400 < 2) {
LAB_001a3cf8:
        s = "invalid-predicate";
        goto LAB_001a3cff;
      }
    }
    s = "lt";
    goto LAB_001a3cff;
  }
  iVar2 = strcmp(O->buffer,"pm");
  if (iVar2 != 0) {
    printOperand(MI,1,(SStream *)CONCAT44(in_register_00000034,OpNo));
    return;
  }
  if ((int)aVar4 < 0x46) {
    switch(aVar4) {
    case ARM64_CC_PL:
    case ARM64_CC_LE:
      goto switchD_001a3bf0_caseD_66;
    case ARM64_CC_VS:
    case ARM64_CC_AL:
      goto switchD_001a3bf0_caseD_67;
    case ARM64_CC_VC:
    case ARM64_CC_HI:
    case ARM64_CC_LS:
    case ARM64_CC_GE:
    case ARM64_CC_LT:
    case ARM64_CC_GT:
      goto switchD_001a3bf0_caseD_68;
    default:
      switch(aVar4) {
      case 0x26:
      case 0x2e:
        goto switchD_001a3bf0_caseD_66;
      case 0x27:
      case 0x2f:
        goto switchD_001a3bf0_caseD_67;
      default:
        goto switchD_001a3bf0_caseD_68;
      }
    }
  }
  switch(aVar4) {
  case 0x46:
  case 0x4e:
switchD_001a3bf0_caseD_66:
    s = "-";
    break;
  case 0x47:
  case 0x4f:
switchD_001a3bf0_caseD_67:
    s = "+";
    break;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
switchD_001a3bf0_caseD_68:
    return;
  default:
    switch(aVar4) {
    case 0x66:
    case 0x6e:
      goto switchD_001a3bf0_caseD_66;
    case 0x67:
    case 0x6f:
      goto switchD_001a3bf0_caseD_67;
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_001a3bf0_caseD_68;
    default:
      if (1 < aVar4 - 0x400) {
        return;
      }
      goto LAB_001a3cf8;
    }
  }
LAB_001a3cff:
  SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNo),s);
  return;
}

Assistant:

static void printPredicateOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	ARMCC_CondCodes CC = (ARMCC_CondCodes)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// Handle the undefined 15 CC value here for printing so we don't abort().
	if ((unsigned)CC == 15) {
		SStream_concat0(O, "<und>");
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.cc = ARM_CC_INVALID;
	} else {
		if (CC != ARMCC_AL) {
			SStream_concat0(O, ARMCC_ARMCondCodeToString(CC));
		}
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.cc = CC + 1;
	}
}